

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O1

void __thiscall
ContractTestOnClassWithInvariant_ThatWhenNoFunctionWasCalledNoConditionAndInvariantWasCalled_Test::
TestBody(ContractTestOnClassWithInvariant_ThatWhenNoFunctionWasCalledNoConditionAndInvariantWasCalled_Test
         *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  string local_30;
  
  local_48.ptr_ = local_48.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_30,"0","sut.invariantWasCalled",(int *)&local_48,
             &(this->super_ContractTestOnClassWithInvariant).sut.invariantWasCalled);
  if ((char)local_30._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_30._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x5e,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_30._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = (this->super_ContractTestOnClassWithInvariant).sut.preConditionWasCalled;
  local_48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_48.ptr_._1_7_,bVar1) ^ 1);
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1 == true) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,(internal *)&local_48,(AssertionResult *)"sut.preConditionWasCalled","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x5f,(char *)CONCAT71(local_30._M_dataplus._M_p._1_7_,
                                      (char)local_30._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p) !=
        &local_30.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p));
    }
    if (local_50.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_50.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
      local_50.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = (this->super_ContractTestOnClassWithInvariant).sut.postConditionWasCalled == 0;
  local_48.ptr_._0_1_ = bVar1;
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,(internal *)&local_48,(AssertionResult *)"sut.postConditionWasCalled",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x60,(char *)CONCAT71(local_30._M_dataplus._M_p._1_7_,
                                      (char)local_30._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p) !=
        &local_30.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p));
    }
    if (local_50.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_50.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
      local_50.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ContractTestOnClassWithInvariant, ThatWhenNoFunctionWasCalledNoConditionAndInvariantWasCalled)
{
  EXPECT_EQ(0, sut.invariantWasCalled);
  EXPECT_FALSE(sut.preConditionWasCalled);
  EXPECT_FALSE(sut.postConditionWasCalled);
}